

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Expr * __thiscall parser::Parser::mkNode(Parser *this,Operator *op,Expr *e1,Expr *e2)

{
  TokenType TVar1;
  Equals *this_00;
  ostream *poVar2;
  Token *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  Token local_380;
  Token local_350;
  Token local_320;
  Token local_2f0;
  Token local_2c0;
  Token local_290;
  Token local_260;
  Token local_230;
  Token local_200;
  Token local_1d0;
  ostringstream message;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&message);
  TVar1 = (op->super_Token).Type;
  switch(TVar1) {
  case EQ:
    this_00 = (Equals *)operator_new(0x58);
    token::Token::Token(&local_350,&op->super_Token);
    ast::Equals::Equals(this_00,&local_350,this->l->line);
    this_01 = &local_350;
    break;
  case NOT_EQ:
    this_00 = (Equals *)operator_new(0x58);
    ast::NotEquals::NotEquals((NotEquals *)this_00,&op->super_Token,this->l->line);
    goto LAB_00111246;
  case GT:
    this_00 = (Equals *)operator_new(0x58);
    token::Token::Token(&local_2f0,&op->super_Token);
    ast::GreaterThan::GreaterThan((GreaterThan *)this_00,&local_2f0,this->l->line);
    this_01 = &local_2f0;
    break;
  case LT:
    this_00 = (Equals *)operator_new(0x58);
    token::Token::Token(&local_290,&op->super_Token);
    ast::LessThan::LessThan((LessThan *)this_00,&local_290,this->l->line);
    this_01 = &local_290;
    break;
  case COMMA:
switchD_00110efe_caseD_108:
    poVar2 = std::operator<<((ostream *)&message,"couldn\'t parse operator type ");
    poVar2 = std::operator<<(poVar2,(string *)&op->symbol);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors,
               &local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    this_00 = (Equals *)0x0;
    goto LAB_0011124e;
  case ASSIGN:
    this_00 = (Equals *)operator_new(0x58);
    token::Token::Token(&local_380,&op->super_Token);
    ast::Assign::Assign((Assign *)this_00,&local_380,this->l->line);
    this_01 = &local_380;
    break;
  case PLUS:
    this_00 = (Equals *)operator_new(0x58);
    token::Token::Token(&local_1d0,&op->super_Token);
    ast::Add::Add((Add *)this_00,&local_1d0,this->l->line);
    this_01 = &local_1d0;
    break;
  case MINUS:
    this_00 = (Equals *)operator_new(0x58);
    token::Token::Token(&local_230,&op->super_Token);
    ast::Sub::Sub((Sub *)this_00,&local_230,this->l->line);
    this_01 = &local_230;
    break;
  case BANG:
    this_00 = (Equals *)operator_new(0x50);
    ast::Not::Not((Not *)this_00,&op->super_Token,this->l->line);
    goto LAB_0011124a;
  case ASTERISK:
    this_00 = (Equals *)operator_new(0x58);
    token::Token::Token(&local_200,&op->super_Token);
    ast::Mult::Mult((Mult *)this_00,&local_200,this->l->line);
    this_01 = &local_200;
    break;
  case DIV:
    this_00 = (Equals *)operator_new(0x58);
    token::Token::Token(&local_260,&op->super_Token);
    ast::Div::Div((Div *)this_00,&local_260,this->l->line);
    this_01 = &local_260;
    break;
  default:
    switch(TVar1) {
    case LT_EQ:
      this_00 = (Equals *)operator_new(0x58);
      token::Token::Token(&local_2c0,&op->super_Token);
      ast::LessThanOrEqual::LessThanOrEqual((LessThanOrEqual *)this_00,&local_2c0,this->l->line);
      this_01 = &local_2c0;
      break;
    case UMINUS:
      this_00 = (Equals *)operator_new(0x50);
      ast::UniarySub::UniarySub((UniarySub *)this_00,&op->super_Token,this->l->line);
      goto LAB_0011124a;
    case GT_EQ:
      this_00 = (Equals *)operator_new(0x58);
      token::Token::Token(&local_320,&op->super_Token);
      ast::GreaterThanOrEqual::GreaterThanOrEqual
                ((GreaterThanOrEqual *)this_00,&local_320,this->l->line);
      this_01 = &local_320;
      break;
    default:
      goto switchD_00110efe_caseD_108;
    case CALL:
      this_00 = (Equals *)__dynamic_cast(e2,&ast::Expr::typeinfo,&ast::CallExpression::typeinfo,0);
      *(Expr **)&(this_00->super_BinaryOp).super_Op.precedence = e1;
      goto LAB_0011124e;
    }
  }
  token::Token::~Token(this_01);
LAB_00111246:
  (this_00->super_BinaryOp).LeftOp = e1;
LAB_0011124a:
  (this_00->super_BinaryOp).RightOp = e2;
LAB_0011124e:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&message);
  return (Expr *)this_00;
}

Assistant:

Expr* Parser::mkNode(Operator& op, Expr* e1, Expr* e2)
{
    std::ostringstream message;
    switch (op.Type) {
        case TokenType::PLUS:
             {
              auto add = new Add(op, l->line);
              add->LeftOp = e1;
              add->RightOp = e2;
              return add;
             }
        case TokenType::ASTERISK:
             {
              auto mul = new Mult(op, l->line);
              mul->LeftOp = e1;
              mul->RightOp = e2;
              return mul;
             }
        case TokenType::MINUS:
           {
             auto sub = new Sub(op, l->line);
             sub->LeftOp = e1;
             sub->RightOp = e2;
             return sub;
           }
        case TokenType::UMINUS:
           {
             auto usub = new UniarySub(op, l->line);
             usub->RightOp = e2;
             return usub;
           }
        case TokenType::BANG:
          {
             auto nt = new Not(op, l->line);
             nt->RightOp = e2;
             return nt;
          }
        case TokenType::DIV:
          {
            auto div = new Div(op, l->line);
            div->LeftOp = e1;
            div->RightOp = e2;
            return div;
          }
         case TokenType::LT:
         {
             auto lt = new LessThan(op, l->line);
             lt->LeftOp = e1;
             lt->RightOp = e2;
             return lt;
         }
         case TokenType::LT_EQ:
          {
             auto lt_eq = new LessThanOrEqual(op, l->line);
             lt_eq->LeftOp = e1;
             lt_eq->RightOp = e2;
             return lt_eq;
          }
          case TokenType::GT:
           {
              auto gt = new GreaterThan(op, l->line);
              gt->LeftOp = e1;
              gt->RightOp = e2;
              return gt;
           }
           case TokenType::GT_EQ:
            {
               auto gt_eq = new GreaterThanOrEqual(op, l->line);
               gt_eq->LeftOp = e1;
               gt_eq->RightOp = e2;
               return gt_eq;
            }
            case TokenType::NOT_EQ:
             {
                auto nt_eq = new NotEquals(op, l->line);
                nt_eq->LeftOp = e1;
                nt_eq->RightOp = e2;
                return nt_eq;
             }
            case TokenType::EQ:
            {
               auto eq = new Equals(op, l->line);
               eq->LeftOp = e1;
               eq->RightOp = e2;
               return eq;
            }
            case TokenType::ASSIGN:
            {
               auto assign = new Assign(op, l->line);
               assign->LeftOp = e1;
               assign->RightOp = e2;
               return assign;
            }
            case TokenType::CALL:
             {
               auto call = dynamic_cast<CallExpression*>(e2);
               call->function = e1;
               return call;
             }
        default:
             message << "couldn't parse operator type " << op.symbol
                   << endl;
             errors.push_back(message.str());
             return nullptr;
    }
}